

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestSplit(void)

{
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *this;
  iterator bytes;
  InputBuffer *buf_00;
  const_string *msg;
  InputBuffer *this_00;
  long lVar3;
  undefined1 auVar4 [16];
  InputBuffer part1;
  OutputBuffer part2;
  size_t in;
  istream is;
  char datain [12];
  OutputBuffer buf;
  string str;
  lazy_ostream *in_stack_fffffffffffffac8;
  basic_cstring<const_char> *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffad8;
  begin *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  OutputBuffer *in_stack_fffffffffffffaf0;
  allocator<char> *in_stack_fffffffffffffb00;
  const_string *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  const_string *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  begin *in_stack_fffffffffffffb38;
  unit_test_log_t *in_stack_fffffffffffffb40;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  undefined1 local_3f8 [56];
  basic_cstring<const_char> local_3c0;
  fpos local_3b0 [32];
  iterator local_388;
  basic_cstring<const_char> local_380;
  undefined1 local_370 [56];
  basic_cstring<const_char> local_338 [2];
  undefined1 local_318 [8];
  undefined1 local_310 [16];
  streamoff local_300;
  basic_cstring<const_char> local_2f8;
  undefined1 local_2e8 [56];
  basic_cstring<const_char> local_2b0;
  undefined1 local_2a0 [24];
  undefined1 local_288 [56];
  basic_cstring<const_char> local_250;
  long local_240;
  char local_238 [404];
  undefined1 local_a4 [35];
  allocator<char> local_81;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffae0,(const_string *)in_stack_fffffffffffffad8,
             (size_t)in_stack_fffffffffffffad0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffad8,
             (log_level)((ulong)in_stack_fffffffffffffad0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffad8,(char (*) [10])in_stack_fffffffffffffad0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> *)
             0x236584);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::~allocator(&local_81);
  avro::OutputBuffer::OutputBuffer
            (in_stack_fffffffffffffaf0,CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8)
            );
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffad0,(data_type *)in_stack_fffffffffffffac8,
             0x236626);
  avro::istream::istream
            ((istream *)in_stack_fffffffffffffae0,(OutputBuffer *)in_stack_fffffffffffffad8);
  local_240 = std::istream::readsome(local_238,(long)local_a4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffad0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
              );
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffad8,(char (*) [1])in_stack_fffffffffffffad0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2a0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2a0._0_8_ = (iterator)0xc;
    in_stack_fffffffffffffad8 = "sizeof(datain)";
    in_stack_fffffffffffffad0 = (basic_cstring<const_char> *)local_2a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_288,local_2a0 + 8,0x2f7,1,2,&local_240,"in");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x236784);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffad0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
              );
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffad8,(char (*) [1])in_stack_fffffffffffffad0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    auVar4 = std::istream::tellg();
    local_310 = auVar4;
    local_300 = std::fpos::operator_cast_to_long((fpos *)local_310);
    local_318 = (undefined1  [8])0xc;
    in_stack_fffffffffffffad8 = "sizeof(datain)";
    in_stack_fffffffffffffad0 = (basic_cstring<const_char> *)local_318;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2e8,&local_2f8,0x2f8,1,2,&local_300,"static_cast<size_t>(is.tellg())");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23691c);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::OutputBuffer
            (in_stack_fffffffffffffaf0,CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8)
            );
  avro::istream::getBuffer((istream *)0x23695b);
  avro::OutputBuffer::append<avro::InputBuffer>
            ((OutputBuffer *)in_stack_fffffffffffffae0,(InputBuffer *)in_stack_fffffffffffffad8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffad0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
              );
    this = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffad8,(char (*) [1])in_stack_fffffffffffffad0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    bytes = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x236a24);
    local_388 = bytes;
    buf_00 = (InputBuffer *)avro::OutputBuffer::size((OutputBuffer *)0x236a45);
    in_stack_fffffffffffffad8 = "buf.size()";
    in_stack_fffffffffffffad0 = (basic_cstring<const_char> *)&stack0xfffffffffffffc70;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_370,&local_380,0x2fc,1,2,&local_388,"part2.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x236ab9);
    in_stack_fffffffffffffb27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb27);
  auVar4 = std::istream::tellg();
  local_3b0._0_16_ = auVar4;
  msg = (const_string *)std::fpos::operator_cast_to_long(local_3b0);
  avro::OutputBuffer::extractData((OutputBuffer *)this,(size_type)bytes);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffad0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               auVar4._0_8_,auVar4._8_8_,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffad8,(char (*) [1])in_stack_fffffffffffffad0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    this_00 = (InputBuffer *)avro::OutputBuffer::size((OutputBuffer *)0x236bdd);
    local_418.m_end = (iterator)this_00;
    lVar3 = std::__cxx11::string::size();
    local_418.m_begin = (iterator)(lVar3 - local_240);
    in_stack_fffffffffffffad8 = "str.size() - in";
    in_stack_fffffffffffffad0 = &local_418;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3f8,&local_408,0x2ff,1,2,&local_418.m_end,"part2.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x236c71);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  printBuffer(buf_00);
  avro::InputBuffer::InputBuffer(this_00,(OutputBuffer *)CONCAT17(uVar2,in_stack_fffffffffffffae8));
  printBuffer(buf_00);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x236ccc);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x236cd9);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x236ce6);
  avro::istream::~istream((istream *)in_stack_fffffffffffffad0);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x236d00);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestSplit()
{
    BOOST_TEST_MESSAGE( "TestSplit");
    {
        const std::string str = "This message is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(str.c_str(), str.size()); 

        char datain[12];
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
        BOOST_CHECK_EQUAL(in, sizeof(datain));
        BOOST_CHECK_EQUAL(static_cast<size_t>(is.tellg()), sizeof(datain));

        OutputBuffer part2;
        part2.append(is.getBuffer());
        BOOST_CHECK_EQUAL(part2.size(), buf.size());
        InputBuffer part1 = part2.extractData(static_cast<size_t>(is.tellg()));

        BOOST_CHECK_EQUAL(part2.size(), str.size() - in);

        printBuffer(part1);
        printBuffer(part2);
    }
}